

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderVertexSpacing.cpp
# Opt level: O3

bool __thiscall
glcts::TessellationShaderVertexSpacing::_tess_coordinate::operator==
          (_tess_coordinate *this,_tess_coordinate *in)

{
  float fVar1;
  float fVar2;
  
  fVar1 = *(float *)this - *(float *)in;
  fVar2 = -fVar1;
  if (-fVar1 <= fVar1) {
    fVar2 = fVar1;
  }
  if (fVar2 < 0.001) {
    fVar1 = *(float *)(this + 4) - *(float *)(in + 4);
    fVar2 = -fVar1;
    if (-fVar1 <= fVar1) {
      fVar2 = fVar1;
    }
    if (fVar2 < 0.001) {
      fVar1 = *(float *)(this + 8) - *(float *)(in + 8);
      fVar2 = -fVar1;
      if (-fVar1 <= fVar1) {
        fVar2 = fVar1;
      }
      if (fVar2 < 0.001) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool TessellationShaderVertexSpacing::_tess_coordinate::operator==(
	const TessellationShaderVertexSpacing::_tess_coordinate& in) const
{
	if (de::abs(this->u - in.u) < epsilon && de::abs(this->v - in.v) < epsilon && de::abs(this->w - in.w) < epsilon)
	{
		return true;
	}
	else
	{
		return false;
	}
}